

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_59ba::PixelOffset::PixelOffset(PixelOffset *this,OledPoint p)

{
  int iVar1;
  int iVar2;
  int *in_RDI;
  Point<int> local_8;
  
  iVar1 = SSD1306::Point<int>::y(&local_8);
  *in_RDI = iVar1 % 8;
  iVar1 = SSD1306::Point<int>::x(&local_8);
  iVar2 = SSD1306::Point<int>::y(&local_8);
  in_RDI[1] = iVar1 / 0x20 + (iVar2 / 8) * 4;
  iVar1 = SSD1306::Point<int>::x(&local_8);
  in_RDI[2] = iVar1 % 0x20 + 1;
  return;
}

Assistant:

PixelOffset(SSD1306::OledPoint p)
        :
            bit{p.y() % 8},
            block{(p.x() / SSD1306::OledI2C::ColumnsPerBlock)
                  + (SSD1306::OledI2C::ColumnsPerRow * (p.y() / 8))},
            byte{SSD1306::OledI2C::DataOffset
                 + (p.x() % SSD1306::OledI2C::ColumnsPerBlock)}
        {
        }